

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

long __thiscall QLocale::toLong(QLocale *this,QStringView s,bool *ok)

{
  long lVar1;
  QStringView str;
  long lVar2;
  bool *in_RCX;
  QLocalePrivate *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QSharedDataPointer::operator_cast_to_QLocalePrivate_
            ((QSharedDataPointer<QLocalePrivate> *)0x4cbd44);
  str.m_data = (storage_type_conflict *)this;
  str.m_size = (qsizetype)ok;
  lVar2 = toIntegral_helper<long>(in_RDI,str,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

long QLocale::toLong(QStringView s, bool *ok) const
{
    return toIntegral_helper<long>(d, s, ok);
}